

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> * __thiscall
kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_>::operator=
          (Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *this,
          Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *other)

{
  Disposer *object;
  Dispose_<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_true> *this_00;
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *pPVar1;
  Disposer *in_RDX;
  
  object = this->disposer;
  this_00 = (Dispose_<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_true> *)this->ptr;
  pPVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pPVar1;
  other->ptr = (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
  if (this_00 != (Dispose_<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_true> *)0x0) {
    Disposer::Dispose_<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_true>::dispose
              (this_00,(PromiseFulfiller<capnp::AnyPointer::Pipeline> *)object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }